

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newarray(HSQUIRRELVM v,SQInteger size)

{
  SQArray *x;
  SQSharedState *in_RDI;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr local_20 [2];
  
  x = SQArray::Create(in_RDI,(SQInteger)in_stack_ffffffffffffffb8);
  SQObjectPtr::SQObjectPtr(local_20,x);
  SQVM::Push((SQVM *)in_RDI,in_stack_ffffffffffffffb8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  return;
}

Assistant:

void sq_newarray(HSQUIRRELVM v,SQInteger size)
{
    v->Push(SQArray::Create(_ss(v), size));
}